

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O1

void __thiscall
dtc::fdt::property::parse_define(property *this,text_input_buffer *input,define_map *defines)

{
  _Elt_pointer psVar1;
  element_type *peVar2;
  _Elt_pointer psVar3;
  iterator iVar4;
  int iVar5;
  _Elt_pointer psVar6;
  string name;
  string local_68;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  psVar1 = (input->input_stack).c.
           super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  psVar3 = (input->input_stack).c.
           super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar3 != psVar1) {
    psVar6 = psVar3;
    if (psVar3 == (input->input_stack).c.
                  super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      psVar6 = (input->input_stack).c.
               super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    peVar2 = psVar6[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar5 = peVar2->cursor;
    if ((((-1 < (long)iVar5) && (iVar5 < peVar2->size)) && (peVar2->buffer[iVar5] == '$')) &&
       (psVar3 != psVar1)) {
      input->cursor = input->cursor + 1;
      if (psVar3 == (input->input_stack).c.
                    super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        psVar3 = (input->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      peVar2 = psVar3[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar5 = peVar2->cursor + 1;
      peVar2->cursor = iVar5;
      if (peVar2->size <= iVar5) {
        std::
        deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
        ::pop_back(&(input->input_stack).c);
      }
    }
  }
  if (defines == (define_map *)0x0) {
    text_input_buffer::parse_error(input,"No predefined properties to match name\n");
    this->valid = false;
    return;
  }
  text_input_buffer::parse_property_name_abi_cxx11_(&local_68,input);
  local_40 = 0;
  local_38 = 0;
  local_48 = &local_38;
  if (local_68._M_string_length != 0) {
    iVar4 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::property>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::property>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&defines->_M_h,&local_68);
    if (local_48 != &local_38) {
      operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
    }
    if (iVar4.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::property>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::push_back
                (&this->values,
                 *(value_type **)
                  (*(long *)((long)iVar4.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::property>_>,_true>
                                   ._M_cur + 0x28) + 0x58));
      goto LAB_001226a7;
    }
  }
  text_input_buffer::parse_error(input,"Undefined property name\n");
  this->valid = false;
LAB_001226a7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void property::parse_define(text_input_buffer &input, define_map *defines)
{
	input.consume('$');
	if (!defines)
	{
		input.parse_error("No predefined properties to match name\n");
		valid = false;
		return;
	}
	string name = input.parse_property_name();
	define_map::iterator found;
	if ((name == string()) ||
	    ((found = defines->find(name)) == defines->end()))
	{
		input.parse_error("Undefined property name\n");
		valid = false;
		return;
	}
	values.push_back((*found).second->values[0]);
}